

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall chrono::utils::ChChaseCamera::Update(ChChaseCamera *this,double step)

{
  int iVar1;
  undefined4 extraout_var;
  ChVector<double> *in_RDX;
  double dVar2;
  ChVector<double> v;
  undefined1 local_58 [16];
  double local_48;
  ChVector<double> local_38;
  
  calcDeriv(&local_38,this,in_RDX);
  local_48 = step * local_38.m_data[2];
  local_58._8_8_ = step * local_38.m_data[1];
  local_58._0_8_ = step * local_38.m_data[0];
  ChVector<double>::operator+=(&this->m_loc,(ChVector<double> *)local_58);
  if (this->m_state == Track) {
    iVar1 = (*(((this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
    local_58 = vsubpd_avx(*(undefined1 (*) [16])(CONCAT44(extraout_var,iVar1) + 8),
                          *(undefined1 (*) [16])(this->m_lastLoc).m_data);
    local_48 = *(double *)(CONCAT44(extraout_var,iVar1) + 0x18) - (this->m_lastLoc).m_data[2];
    dVar2 = ChVector<double>::Length2((ChVector<double> *)local_58);
    if (10000.0 < dVar2) {
      SetState(this,Chase);
    }
  }
  return;
}

Assistant:

void ChChaseCamera::Update(double step) {
    // Perform a simple Euler integration step (derivative controller).
    m_loc += step * calcDeriv(m_loc);

    if (m_state != Track)
        return;

    // If in 'Track' mode, force a state change if too far from tracked body.
    double dist2 = (m_chassis->GetFrame_REF_to_abs().GetPos() - m_lastLoc).Length2();
    if (dist2 > m_maxTrackDist2)
        SetState(Chase);
}